

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_DataBlob_impl.hpp
# Opt level: O0

uint8_t * __thiscall hrgls::datablob::DataBlob::Data(DataBlob *this)

{
  hrgls_Status hVar1;
  undefined1 local_24 [4];
  DataBlob *pDStack_20;
  uint32_t size;
  uint8_t *ret;
  DataBlob *this_local;
  
  pDStack_20 = (DataBlob *)0x0;
  if (this->m_private->blob == (hrgls_DataBlob)0x0) {
    this->m_private->status = 0x3ee;
    this_local = (DataBlob *)0x0;
  }
  else {
    ret = (uint8_t *)this;
    hVar1 = hrgls_DataBlobGetData(this->m_private->blob,&stack0xffffffffffffffe0,local_24);
    this->m_private->status = hVar1;
    this_local = pDStack_20;
  }
  return (uint8_t *)this_local;
}

Assistant:

const uint8_t * DataBlob::Data() const
    {
      const uint8_t *ret = nullptr;
      if (!m_private->blob) {
        m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
        return ret;
      }
      uint32_t size;
      m_private->status = hrgls_DataBlobGetData(m_private->blob, &ret, &size);
      return ret;
    }